

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

int impl_sign_picnic3(picnic_instance_t *instance,uint8_t *plaintext,uint8_t *private_key,
                     uint8_t *public_key,uint8_t *msg,size_t msglen,uint8_t *signature,
                     size_t *signature_len)

{
  _Bool _Var1;
  int iVar2;
  picnic_instance_t *in_RDI;
  long *in_stack_00000010;
  int ret;
  signature2_t sig;
  signature2_t *in_stack_00000158;
  size_t in_stack_00000160;
  uint8_t *in_stack_00000168;
  uint8_t *in_stack_00000170;
  uint8_t *in_stack_00000178;
  uint8_t *in_stack_00000180;
  picnic_instance_t *in_stack_ffffffffffffff58;
  signature2_t *in_stack_ffffffffffffff60;
  int local_94;
  picnic_instance_t *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  uint8_t *in_stack_ffffffffffffff80;
  signature2_t *in_stack_ffffffffffffff88;
  
  local_94 = -1;
  _Var1 = allocateSignature2(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((_Var1) &&
     (local_94 = sign_picnic3(in_stack_00000180,in_stack_00000178,in_stack_00000170,
                              in_stack_00000168,in_stack_00000160,in_stack_00000158,
                              (picnic_instance_t *)in_stack_ffffffffffffff60),
     in_stack_ffffffffffffff58 = in_RDI, local_94 == 0)) {
    iVar2 = serializeSignature2(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff58 = in_RDI;
    if (iVar2 == -1) {
      local_94 = -1;
    }
    else {
      *in_stack_00000010 = (long)iVar2;
      local_94 = 0;
    }
  }
  freeSignature2(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return local_94;
}

Assistant:

int impl_sign_picnic3(const picnic_instance_t* instance, const uint8_t* plaintext,
                      const uint8_t* private_key, const uint8_t* public_key, const uint8_t* msg,
                      size_t msglen, uint8_t* signature, size_t* signature_len) {
  signature2_t sig;
  int ret = -1;
  if (!allocateSignature2(&sig, instance)) {
    goto Exit;
  }

  ret = sign_picnic3(private_key, public_key, plaintext, msg, msglen, &sig, instance);
  picnic_declassify(&ret, sizeof(ret));
  if (ret != EXIT_SUCCESS) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to create signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }

  ret = serializeSignature2(&sig, signature, *signature_len, instance);
  if (ret == -1) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to serialize signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }
  *signature_len = ret;
  ret            = 0;

Exit:
  freeSignature2(&sig, instance);
  return ret;
}